

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlSimulateOne(Fra_Sml_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Aig_Obj_t *pObj;
  int iVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    iVar3 = 1;
  }
  else {
    iVar3 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8) >> 7) -
            (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),0xc) >> 0x1f)) +
            (int)local_40.tv_sec * -1000000;
  }
  if (0 < p->nFrames) {
    pAVar4 = p->pAig;
    iVar13 = 0;
    do {
      pVVar6 = pAVar4->vObjs;
      if (0 < pVVar6->nSize) {
        lVar10 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar6->pArray[lVar10];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Fra_SmlNodeSimulate(p,pObj,iVar13);
            pAVar4 = p->pAig;
          }
          lVar10 = lVar10 + 1;
          pVVar6 = pAVar4->vObjs;
        } while (lVar10 < pVVar6->nSize);
      }
      uVar9 = pAVar4->nObjs[3] - pAVar4->nRegs;
      uVar11 = (ulong)uVar9;
      if (uVar9 != 0 && pAVar4->nRegs <= pAVar4->nObjs[3]) {
        lVar10 = 0;
        do {
          if (pAVar4->vCos->nSize <= lVar10) goto LAB_006a15aa;
          Fra_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar4->vCos->pArray[lVar10],iVar13);
          lVar10 = lVar10 + 1;
          pAVar4 = p->pAig;
          uVar11 = (long)pAVar4->nObjs[3] - (long)pAVar4->nRegs;
        } while (lVar10 < (long)uVar11);
      }
      if (iVar13 == p->nFrames + -1) break;
      pVVar6 = pAVar4->vCos;
      if ((int)uVar11 < pVVar6->nSize) {
        uVar12 = uVar11 & 0xffffffff;
        do {
          if ((int)uVar11 < 0) goto LAB_006a15aa;
          Fra_SmlNodeCopyFanin(p,(Aig_Obj_t *)pVVar6->pArray[uVar12],iVar13);
          uVar12 = uVar12 + 1;
          pAVar4 = p->pAig;
          pVVar6 = pAVar4->vCos;
        } while ((int)uVar12 < pVVar6->nSize);
      }
      iVar5 = pAVar4->nRegs;
      if (0 < iVar5) {
        iVar7 = 0;
        do {
          uVar9 = (pAVar4->nObjs[3] - iVar5) + iVar7;
          if (((((int)uVar9 < 0) || (pAVar4->vCos->nSize <= (int)uVar9)) ||
              (uVar8 = (pAVar4->nObjs[2] - iVar5) + iVar7, (int)uVar8 < 0)) ||
             (pAVar4->vCis->nSize <= (int)uVar8)) {
LAB_006a15aa:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Fra_SmlNodeTransferNext
                    (p,(Aig_Obj_t *)pAVar4->vCos->pArray[uVar9],
                     (Aig_Obj_t *)pAVar4->vCis->pArray[uVar8],iVar13);
          iVar7 = iVar7 + 1;
          pAVar4 = p->pAig;
          iVar5 = pAVar4->nRegs;
        } while (iVar7 < iVar5);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < p->nFrames);
  }
  iVar13 = clock_gettime(3,&local_40);
  if (iVar13 < 0) {
    iVar13 = -1;
  }
  else {
    iVar13 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
  }
  uVar1 = p->nSimRounds;
  uVar2 = p->timeSim;
  p->nSimRounds = uVar1 + 1;
  p->timeSim = iVar13 + iVar3 + uVar2;
  return;
}

Assistant:

void Fra_SmlSimulateOne( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Fra_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Aig_ManForEachPoSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into outputs
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into the inputs
        Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
            Fra_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}